

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsChecker.cpp
# Opt level: O3

bool __thiscall DatUnpacker::ArgumentsChecker::checkSource(ArgumentsChecker *this,string *source)

{
  char cVar1;
  bool bVar2;
  path local_48;
  
  if (source->_M_string_length == 0) {
    bVar2 = false;
    std::__cxx11::string::_M_replace
              ((ulong)this,0,(char *)(this->_errorMessage)._M_string_length,0x10a024);
  }
  else {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_48,source,auto_format);
    cVar1 = std::filesystem::status(&local_48);
    std::filesystem::__cxx11::path::~path(&local_48);
    bVar2 = true;
    if (cVar1 != '\x01') {
      std::operator+(&local_48._M_pathname,"DAT file not found: ",source);
      std::__cxx11::string::operator=((string *)this,(string *)&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_pathname._M_dataplus._M_p != &local_48._M_pathname.field_2) {
        operator_delete(local_48._M_pathname._M_dataplus._M_p,
                        local_48._M_pathname.field_2._M_allocated_capacity + 1);
      }
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool ArgumentsChecker::checkSource(const std::string& source) {
        if (source.length() == 0) {
            _errorMessage = "Path to DAT file not specified";
            return false;
        }

        if (!std::filesystem::is_regular_file(source)) {
            _errorMessage = "DAT file not found: " + source;
            return false;
        }

        return true;
    }